

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O2

int SetMaxAngleIM483I(IM483I *pIM483I,double angle)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (int)((angle * 116000.0) / (pIM483I->MaxAngle - pIM483I->MinAngle));
  iVar2 = 0x1c520;
  if (iVar1 < 0x1c520) {
    iVar2 = iVar1;
  }
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = SetMotorRelativeIM483I(pIM483I,-iVar1,-(uint)(angle == 0.0) & 1);
  return (int)(iVar2 != 0);
}

Assistant:

inline int SetMaxAngleIM483I(IM483I* pIM483I, double angle)
{
	int val = 0;

	// Convert angle (in rad) into value for the motor.
	val = (int)(angle*(MAX_IM483I-MIN_IM483I)/(pIM483I->MaxAngle-pIM483I->MinAngle));

	val = max(min(val, MAX_IM483I), MIN_IM483I);

	if (SetMotorRelativeIM483I(pIM483I, -val, (angle == 0.0)? TRUE: FALSE) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}